

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O3

int xmlTextReaderStandalone(xmlTextReaderPtr reader)

{
  int iVar1;
  xmlDocPtr pxVar2;
  
  iVar1 = -1;
  if ((reader != (xmlTextReaderPtr)0x0) &&
     ((pxVar2 = reader->doc, pxVar2 != (xmlDocPtr)0x0 ||
      ((reader->ctxt != (xmlParserCtxtPtr)0x0 &&
       (pxVar2 = reader->ctxt->myDoc, pxVar2 != (xmlDocPtr)0x0)))))) {
    iVar1 = pxVar2->standalone;
  }
  return iVar1;
}

Assistant:

int
xmlTextReaderStandalone(xmlTextReaderPtr reader) {
    xmlDocPtr doc = NULL;
    if (reader == NULL)
	return(-1);
    if (reader->doc != NULL)
        doc = reader->doc;
    else if (reader->ctxt != NULL)
	doc = reader->ctxt->myDoc;
    if (doc == NULL)
	return(-1);

    return(doc->standalone);
}